

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O2

void av1_highbd_convolve_2d_scale_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  ushort uVar4;
  ushort uVar5;
  int16_t *piVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  long lVar16;
  uint16_t *puVar17;
  long lVar18;
  uint16_t *puVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint16_t uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint16_t *puVar32;
  uint16_t *puVar33;
  undefined1 (*pauVar34) [16];
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar42;
  short sVar45;
  short sVar46;
  short sVar47;
  int iVar48;
  undefined1 auVar44 [16];
  int iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int16_t *piStack_10ca0;
  int16_t tmp [34304];
  undefined8 uVar43;
  
  iVar22 = (h + -1) * y_step_qn + subpel_y_qn >> 10;
  uVar4 = filter_params_y->taps;
  iVar1 = iVar22 + (uint)uVar4;
  piStack_10ca0 = tmp;
  memset(piStack_10ca0,0,0x10c00);
  iVar10 = conv_params->round_0;
  bVar12 = (byte)iVar10;
  iVar30 = 1 << (bVar12 & 0x1f);
  iVar23 = ((uVar4 >> 1) - 1) * src_stride;
  iVar28 = 1 << ((char)bd + 6U & 0x1f);
  iVar9 = iVar30 / 2 + iVar28;
  auVar36 = ZEXT416((uint)conv_params->round_0);
  lVar11 = (long)src_stride;
  lVar16 = (long)iVar1;
  uVar21 = 0;
  if (0 < w) {
    uVar21 = (ulong)(uint)w;
  }
  for (uVar27 = 0; uVar27 != uVar21; uVar27 = uVar27 + 1) {
    uVar29 = (uint)subpel_x_qn >> 6 & 0xf;
    piVar6 = filter_params_x->filter_ptr;
    uVar5 = filter_params_x->taps;
    auVar37 = *(undefined1 (*) [16])(piVar6 + uVar29 * uVar5);
    puVar17 = src + ((long)(subpel_x_qn >> 10) - (long)iVar23);
    puVar32 = src + (((long)(subpel_x_qn >> 10) + -3) - (long)iVar23);
    for (lVar26 = 0; lVar26 <= (int)(iVar22 + (uint)uVar4 + -4); lVar26 = lVar26 + 4) {
      auVar38 = pmaddwd(*(undefined1 (*) [16])(puVar17 + -3),auVar37);
      auVar39 = pmaddwd(*(undefined1 (*) [16])(puVar17 + lVar11 + -3),auVar37);
      auVar38 = phaddd(auVar38,auVar39);
      auVar39 = pmaddwd(*(undefined1 (*) [16])(puVar17 + (long)(src_stride * 2) + -3),auVar37);
      auVar41 = pmaddwd(*(undefined1 (*) [16])(puVar17 + (long)(src_stride * 3) + -3),auVar37);
      auVar39 = phaddd(auVar39,auVar41);
      auVar38 = phaddd(auVar38,auVar39);
      auVar39._0_4_ = auVar38._0_4_ + iVar9 >> auVar36;
      auVar39._4_4_ = auVar38._4_4_ + iVar9 >> auVar36;
      auVar39._8_4_ = auVar38._8_4_ + iVar9 >> auVar36;
      auVar39._12_4_ = auVar38._12_4_ + iVar9 >> auVar36;
      auVar38 = packusdw(auVar39,auVar39);
      *(long *)(piStack_10ca0 + lVar26) = auVar38._0_8_;
      puVar17 = puVar17 + lVar11 * 4;
      puVar32 = puVar32 + lVar11 * 4;
    }
    for (; lVar26 < lVar16; lVar26 = lVar26 + 1) {
      iVar20 = iVar28;
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        iVar20 = iVar20 + (uint)puVar32[lVar18] *
                          (int)*(short *)((long)piVar6 +
                                         lVar18 * 2 + (ulong)((uint)uVar5 * 2) * (ulong)uVar29);
      }
      tmp[uVar27 * lVar16 + lVar26] = (int16_t)(iVar20 + (iVar30 >> 1) >> (bVar12 & 0x1f));
      puVar32 = puVar32 + lVar11;
    }
    subpel_x_qn = subpel_x_qn + x_step_qn;
    piStack_10ca0 = piStack_10ca0 + lVar16;
  }
  bVar12 = ((char)bd - bVar12) + 0xe;
  bVar15 = (byte)conv_params->round_1;
  bVar13 = bVar12 - bVar15;
  auVar36 = ZEXT416((uint)conv_params->round_1);
  puVar17 = conv_params->dst;
  uVar29 = 0xff;
  if (bd == 0xc) {
    uVar29 = 0xfff;
  }
  if (bd == 10) {
    uVar29 = 0x3ff;
  }
  iVar9 = conv_params->dst_stride;
  auVar37 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
  uVar29 = 0xe - (iVar10 + conv_params->round_1);
  bVar14 = (byte)uVar29;
  auVar38 = ZEXT416(uVar29);
  iVar28 = (1 << (bVar14 & 0x1f)) >> 1;
  iVar23 = 1 << (bVar12 & 0x1f);
  iVar10 = conv_params->fwd_offset;
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
  iVar10 = conv_params->bck_offset;
  auVar40._4_4_ = iVar10;
  auVar40._0_4_ = iVar10;
  auVar40._8_4_ = iVar10;
  auVar40._12_4_ = iVar10;
  iVar22 = ((1 << (bVar15 & 0x1f)) >> 1) + iVar23;
  iVar10 = (-1 << (bVar13 - 1 & 0x1f)) + (-1 << (bVar13 & 0x1f)) + iVar28;
  uVar21 = (ulong)(uint)h;
  if (h < 1) {
    uVar21 = 0;
  }
  uVar27 = 0;
  puVar32 = puVar17;
  do {
    if (uVar27 == uVar21) {
      return;
    }
    uVar29 = (uint)subpel_y_qn >> 6 & 0xf;
    pauVar34 = (undefined1 (*) [16])(tmp + (subpel_y_qn >> 10));
    piVar6 = filter_params_y->filter_ptr;
    uVar4 = filter_params_y->taps;
    auVar39 = *(undefined1 (*) [16])(piVar6 + uVar29 * uVar4);
    puVar2 = dst + uVar27 * (long)dst_stride;
    puVar3 = puVar17 + uVar27 * (long)iVar9;
    puVar19 = puVar32;
    for (lVar11 = 0; lVar11 <= w + -4; lVar11 = lVar11 + 4) {
      auVar44 = pmaddwd(*pauVar34,auVar39);
      auVar50 = pmaddwd(*(undefined1 (*) [16])(*pauVar34 + lVar16 * 2),auVar39);
      auVar44 = phaddd(auVar44,auVar50);
      auVar50 = pmaddwd(*(undefined1 (*) [16])(*pauVar34 + (long)(iVar1 * 2) * 2),auVar39);
      auVar51 = pmaddwd(*(undefined1 (*) [16])(*pauVar34 + (long)(iVar1 * 3) * 2),auVar39);
      auVar51 = phaddd(auVar50,auVar51);
      auVar44 = phaddd(auVar44,auVar51);
      auVar50._0_4_ = auVar44._0_4_ + iVar22 >> auVar36;
      auVar50._4_4_ = auVar44._4_4_ + iVar22 >> auVar36;
      auVar50._8_4_ = auVar44._8_4_ + iVar22 >> auVar36;
      auVar50._12_4_ = auVar44._12_4_ + iVar22 >> auVar36;
      if (conv_params->is_compound == 0) {
        auVar44._0_4_ = auVar50._0_4_ + iVar10;
        auVar44._4_4_ = auVar50._4_4_ + iVar10;
        auVar44._8_4_ = auVar50._8_4_ + iVar10;
        auVar44._12_4_ = auVar50._12_4_ + iVar10;
        auVar51 = psraw(auVar44,auVar38);
LAB_0037c108:
        auVar44 = packusdw(auVar51,auVar51);
        sVar7 = auVar37._0_2_;
        sVar42 = auVar44._0_2_;
        sVar8 = auVar37._2_2_;
        sVar45 = auVar44._2_2_;
        sVar46 = auVar44._4_2_;
        sVar47 = auVar44._6_2_;
        uVar43 = CONCAT26((ushort)(sVar8 < sVar47) * sVar8 | (ushort)(sVar8 >= sVar47) * sVar47,
                          CONCAT24((ushort)(sVar7 < sVar46) * sVar7 |
                                   (ushort)(sVar7 >= sVar46) * sVar46,
                                   CONCAT22((ushort)(sVar8 < sVar45) * sVar8 |
                                            (ushort)(sVar8 >= sVar45) * sVar45,
                                            (ushort)(sVar7 < sVar42) * sVar7 |
                                            (ushort)(sVar7 >= sVar42) * sVar42)));
        puVar33 = puVar2 + lVar11;
      }
      else {
        if (conv_params->do_average != 0) {
          auVar44 = pmovzxwd(auVar51,*(undefined8 *)puVar19);
          if (conv_params->use_dist_wtd_comp_avg == 0) {
            iVar30 = auVar50._0_4_ + auVar44._0_4_ >> 1;
            iVar20 = auVar50._4_4_ + auVar44._4_4_ >> 1;
            iVar48 = auVar50._8_4_ + auVar44._8_4_ >> 1;
            iVar49 = auVar50._12_4_ + auVar44._12_4_ >> 1;
          }
          else {
            auVar51 = pmulld(auVar44,auVar41);
            auVar44 = pmulld(auVar50,auVar40);
            iVar30 = auVar44._0_4_ + auVar51._0_4_ >> 4;
            iVar20 = auVar44._4_4_ + auVar51._4_4_ >> 4;
            iVar48 = auVar44._8_4_ + auVar51._8_4_ >> 4;
            iVar49 = auVar44._12_4_ + auVar51._12_4_ >> 4;
          }
          auVar51._0_4_ = iVar30 + iVar10 >> auVar38;
          auVar51._4_4_ = iVar20 + iVar10 >> auVar38;
          auVar51._8_4_ = iVar48 + iVar10 >> auVar38;
          auVar51._12_4_ = iVar49 + iVar10 >> auVar38;
          goto LAB_0037c108;
        }
        auVar44 = packusdw(auVar50,auVar50);
        uVar43 = auVar44._0_8_;
        puVar33 = puVar19;
      }
      *(undefined8 *)puVar33 = uVar43;
      puVar19 = puVar19 + 4;
      pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar16 * 8);
    }
    for (; lVar11 < w; lVar11 = lVar11 + 1) {
      iVar30 = iVar23;
      for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
        iVar30 = iVar30 + (int)*(short *)(*pauVar34 + lVar26 * 2) *
                          (int)*(short *)((long)piVar6 +
                                         lVar26 * 2 + (ulong)((uint)uVar4 * 2) * (ulong)uVar29);
      }
      bVar15 = (byte)conv_params->round_1;
      uVar25 = ((1 << (bVar15 & 0x1f)) >> 1) + iVar30 >> (bVar15 & 0x1f);
      if (conv_params->is_compound == 0) {
        uVar25 = uVar25 & 0xffff;
LAB_0037c1b3:
        uVar25 = (int)((-1 << (bVar12 - bVar15 & 0x1f)) + iVar28 +
                       (-1 << ((bVar12 - bVar15) - 1 & 0x1f)) + uVar25) >> (bVar14 & 0x1f);
        if (bd == 10) {
          bVar35 = uVar25 < 0x3ff;
          uVar31 = 0x3ff;
        }
        else if (bd == 0xc) {
          bVar35 = uVar25 < 0xfff;
          uVar31 = 0xfff;
        }
        else {
          bVar35 = uVar25 < 0xff;
          uVar31 = 0xff;
        }
        if (bVar35) {
          uVar31 = uVar25;
        }
        puVar19 = puVar2;
        uVar24 = (uint16_t)uVar31;
        if ((int)uVar25 < 0) {
          uVar24 = 0;
        }
      }
      else {
        puVar19 = puVar3;
        uVar24 = (uint16_t)uVar25;
        if (conv_params->do_average != 0) {
          uVar31 = (uint)puVar3[lVar11];
          if (conv_params->use_dist_wtd_comp_avg == 0) {
            uVar25 = (uVar25 & 0xffff) + uVar31 >> 1;
          }
          else {
            uVar25 = (int)((uVar25 & 0xffff) * conv_params->bck_offset +
                          uVar31 * conv_params->fwd_offset) >> 4;
          }
          goto LAB_0037c1b3;
        }
      }
      puVar19[lVar11] = uVar24;
      pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar16 * 2);
    }
    uVar27 = uVar27 + 1;
    subpel_y_qn = subpel_y_qn + y_step_qn;
    puVar32 = puVar32 + iVar9;
  } while( true );
}

Assistant:

void av1_highbd_convolve_2d_scale_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int x_step_qn, const int subpel_y_qn, const int y_step_qn,
    ConvolveParams *conv_params, int bd) {
  // TODO(yaowu): Move this out of stack
  DECLARE_ALIGNED(16, int16_t,
                  tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE]);
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;

  memset(tmp, 0, sizeof(tmp));
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  highbd_hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h,
                  subpel_x_qn, x_step_qn, filter_params_x, conv_params->round_0,
                  bd);

  // vertical filter (input is transposed)
  highbd_vfilter8(tmp, im_h, dst, dst_stride, w, h, subpel_y_qn, y_step_qn,
                  filter_params_y, conv_params, bd);
}